

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Record.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  allocator<char> aStack_3a8;
  byte local_3a7;
  byte local_3a6;
  byte local_3a5;
  byte local_3a4;
  byte local_3a3;
  byte local_3a2;
  byte local_3a1;
  string local_3a0;
  string local_380;
  string str;
  Record rec;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,"frames/100/log.txt",(allocator<char> *)&rec);
  gtar::Record::Record(&rec,&str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"",(allocator<char> *)&local_380);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"log.txt",(allocator<char> *)&local_3a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"100",&aStack_3a8);
  local_3a1 = check(&rec,&local_50,&local_70,&local_90,Discrete,UInt8,Text,true,0x2f);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  skipAbsolute(&local_380,&str);
  gtar::Record::getPath_abi_cxx11_(&local_3a0,&rec);
  local_3a2 = checkstr(&local_380,&local_3a0,true,0x30);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_380);
  gtar::Record::~Record(&rec);
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,"frames/100/log.txt",(allocator<char> *)&rec);
  gtar::Record::Record(&rec,&str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"",(allocator<char> *)&local_380);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"lo.txt",(allocator<char> *)&local_3a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"100",&aStack_3a8);
  bVar1 = check(&rec,&local_b0,&local_d0,&local_f0,Discrete,UInt8,Text,false,0x36);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  skipAbsolute(&local_380,&str);
  gtar::Record::getPath_abi_cxx11_(&local_3a0,&rec);
  local_3a3 = checkstr(&local_380,&local_3a0,true,0x37);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_380);
  gtar::Record::~Record(&rec);
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,"frames/100/position.f32.ind",(allocator<char> *)&rec);
  gtar::Record::Record(&rec,&str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"",(allocator<char> *)&local_380);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"position",(allocator<char> *)&local_3a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"100",&aStack_3a8);
  bVar2 = check(&rec,&local_110,&local_130,&local_150,Discrete,Float32,Individual,true,0x3d);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  skipAbsolute(&local_380,&str);
  gtar::Record::getPath_abi_cxx11_(&local_3a0,&rec);
  local_3a4 = checkstr(&local_380,&local_3a0,true,0x3e);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_380);
  gtar::Record::~Record(&rec);
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,"velocity.u64.uni",(allocator<char> *)&rec);
  gtar::Record::Record(&rec,&str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"",(allocator<char> *)&local_380);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"velocity",(allocator<char> *)&local_3a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"",&aStack_3a8);
  local_3a5 = check(&rec,&local_170,&local_190,&local_1b0,Constant,UInt64,Uniform,true,0x44);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_170);
  skipAbsolute(&local_380,&str);
  gtar::Record::getPath_abi_cxx11_(&local_3a0,&rec);
  bVar3 = checkstr(&local_380,&local_3a0,true,0x45);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_380);
  gtar::Record::~Record(&rec);
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,"/vars/stdout.txt/12",(allocator<char> *)&rec);
  gtar::Record::Record(&rec,&str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"",(allocator<char> *)&local_380);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"stdout.txt",(allocator<char> *)&local_3a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"12",&aStack_3a8);
  local_3a6 = check(&rec,&local_1d0,&local_1f0,&local_210,Continuous,UInt8,Text,true,0x4b);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  skipAbsolute(&local_380,&str);
  gtar::Record::getPath_abi_cxx11_(&local_3a0,&rec);
  local_3a7 = checkstr(&local_380,&local_3a0,true,0x4c);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_380);
  gtar::Record::~Record(&rec);
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,"/rigid_body/frames/0/angular_momentum.f64.ind",(allocator<char> *)&rec)
  ;
  gtar::Record::Record(&rec,&str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"rigid_body",(allocator<char> *)&local_380);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"angular_momentum",(allocator<char> *)&local_3a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"0",&aStack_3a8);
  bVar4 = check(&rec,&local_230,&local_250,&local_270,Discrete,Float64,Individual,true,0x52);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  skipAbsolute(&local_380,&str);
  gtar::Record::getPath_abi_cxx11_(&local_3a0,&rec);
  bVar5 = checkstr(&local_380,&local_3a0,true,0x53);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_380);
  gtar::Record::~Record(&rec);
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,"frame/2000/position.f32.ind",(allocator<char> *)&rec);
  gtar::Record::Record(&rec,&str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"frame/2000",(allocator<char> *)&local_380);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"position",(allocator<char> *)&local_3a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"",&aStack_3a8);
  bVar6 = check(&rec,&local_290,&local_2b0,&local_2d0,Constant,Float32,Individual,true,0x59);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  skipAbsolute(&local_380,&str);
  gtar::Record::getPath_abi_cxx11_(&local_3a0,&rec);
  bVar7 = checkstr(&local_380,&local_3a0,true,0x5a);
  bVar8 = local_3a1 | local_3a2;
  bVar10 = bVar1 | local_3a3;
  bVar9 = bVar2 | local_3a4 | local_3a5;
  bVar11 = bVar3 | local_3a6 | local_3a7;
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_380);
  gtar::Record::~Record(&rec);
  std::__cxx11::string::~string((string *)&str);
  return (byte)(((bVar5 || bVar6) || bVar7) | bVar11 | bVar4 | bVar9 | bVar10 | bVar8) & 1;
}

Assistant:

int main()
{
    int result(0);

    {
        string str("frames/100/log.txt");
        Record rec(str);
        result |= check(rec, "", "log.txt", "100", Discrete, UInt8, Text, true, __LINE__);
        result |= checkstr(skipAbsolute(str), rec.getPath(), true, __LINE__);
    }

    {
        string str("frames/100/log.txt");
        Record rec(str);
        result |= check(rec, "", "lo.txt", "100", Discrete, UInt8, Text, false, __LINE__);
        result |= checkstr(skipAbsolute(str), rec.getPath(), true, __LINE__);
    }

    {
        string str("frames/100/position.f32.ind");
        Record rec(str);
        result |= check(rec, "", "position", "100", Discrete, Float32, Individual, true, __LINE__);
        result |= checkstr(skipAbsolute(str), rec.getPath(), true, __LINE__);
    }

    {
        string str("velocity.u64.uni");
        Record rec(str);
        result |= check(rec, "", "velocity", "", Constant, UInt64, Uniform, true, __LINE__);
        result |= checkstr(skipAbsolute(str), rec.getPath(), true, __LINE__);
    }

    {
        string str("/vars/stdout.txt/12");
        Record rec(str);
        result |= check(rec, "", "stdout.txt", "12", Continuous, UInt8, Text, true, __LINE__);
        result |= checkstr(skipAbsolute(str), rec.getPath(), true, __LINE__);
    }

    {
        string str("/rigid_body/frames/0/angular_momentum.f64.ind");
        Record rec(str);
        result |= check(rec, "rigid_body", "angular_momentum", "0", Discrete, Float64, Individual, true, __LINE__);
        result |= checkstr(skipAbsolute(str), rec.getPath(), true, __LINE__);
    }

    {
        string str("frame/2000/position.f32.ind");
        Record rec(str);
        result |= check(rec, "frame/2000", "position", "", Constant, Float32, Individual, true, __LINE__);
        result |= checkstr(skipAbsolute(str), rec.getPath(), true, __LINE__);
    }

    return result;
}